

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::initializeFaceTree(btSoftBody *this)

{
  int iVar1;
  Face *pFVar2;
  btDbvtNode *pbVar3;
  btDbvt *in_RDI;
  Face *f;
  int i;
  btDbvt *in_stack_ffffffffffffffb0;
  bool *data;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  btScalar in_stack_ffffffffffffffdc;
  Face *in_stack_ffffffffffffffe0;
  int local_c;
  
  btDbvt::clear(in_stack_ffffffffffffffb0);
  local_c = 0;
  while( true ) {
    iVar4 = local_c;
    iVar1 = btAlignedObjectArray<btSoftBody::Face>::size
                      ((btAlignedObjectArray<btSoftBody::Face> *)&in_RDI[9].m_rayTestStack.m_data);
    if (iVar1 <= iVar4) break;
    pFVar2 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Face> *)&in_RDI[9].m_rayTestStack.m_data,
                        local_c);
    data = &in_RDI[0xd].m_stkStack.m_ownsMemory;
    VolumeOf(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    pbVar3 = btDbvt::insert(in_RDI,(btDbvtVolume *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),data);
    pFVar2->m_leaf = pbVar3;
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void			btSoftBody::initializeFaceTree()
{
	m_fdbvt.clear();
	for(int i=0;i<m_faces.size();++i)
	{
		Face&	f=m_faces[i];
		f.m_leaf=m_fdbvt.insert(VolumeOf(f,0),&f);
	}
}